

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::processSkipSecondPass(Assembler *this,string *line)

{
  int iVar1;
  pointer ppVar2;
  value_type local_59;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>
  local_58 [3];
  string local_40;
  int local_1c;
  string *psStack_18;
  int value;
  string *line_local;
  Assembler *this_local;
  
  psStack_18 = line;
  line_local = &this->inputFileName;
  std::__cxx11::string::string((string *)&local_40,(string *)line);
  iVar1 = literalToDecimal(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  locationCounter = iVar1 + locationCounter;
  local_1c = iVar1;
  while (local_1c != 0) {
    local_1c = local_1c + -1;
    local_58[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
         ::find(&this->codeBySection,&currentSectionName_abi_cxx11_);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>
             ::operator->(local_58);
    local_59 = '\0';
    std::vector<char,_std::allocator<char>_>::push_back(&ppVar2->second,&local_59);
  }
  return;
}

Assistant:

void Assembler::processSkipSecondPass(string line) {
    int value = literalToDecimal(line);
    locationCounter += value;
    while (value--) {
        codeBySection.find(currentSectionName)->second.push_back(0);
    }

}